

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O3

int SaveEXRImageToFile(EXRImage *exr_image,EXRHeader *exr_header,char *filename,char **err)

{
  int iVar1;
  FILE *__s;
  size_t __n;
  char *pcVar2;
  uchar *mem;
  uchar *local_30;
  
  if ((filename == (char *)0x0 || exr_image == (EXRImage *)0x0) ||
     (exr_header->compression_type < 0)) {
    iVar1 = -3;
    if (err == (char **)0x0) {
      return -3;
    }
    pcVar2 = "Invalid argument.";
  }
  else if (exr_header->compression_type == 0x80) {
    iVar1 = 0;
    if (err == (char **)0x0) {
      return 0;
    }
    pcVar2 = "ZFP compression is not supported in this build.";
  }
  else {
    __s = fopen(filename,"wb");
    if (__s != (FILE *)0x0) {
      local_30 = (uchar *)0x0;
      __n = SaveEXRImageToMemory(exr_image,exr_header,&local_30,err);
      if (local_30 != (uchar *)0x0 && __n != 0) {
        fwrite(local_30,1,__n,__s);
      }
      free(local_30);
      fclose(__s);
      return 0;
    }
    iVar1 = -6;
    if (err == (char **)0x0) {
      return -6;
    }
    pcVar2 = "Cannot write a file.";
  }
  *err = pcVar2;
  return iVar1;
}

Assistant:

int SaveEXRImageToFile(const EXRImage *exr_image, const EXRHeader *exr_header,
                       const char *filename, const char **err) {
  if (exr_image == NULL || filename == NULL ||
      exr_header->compression_type < 0) {
    if (err) {
      (*err) = "Invalid argument.";
    }
    return TINYEXR_ERROR_INVALID_ARGUMENT;
  }

#if !TINYEXR_USE_PIZ
  if (exr_header->compression_type == TINYEXR_COMPRESSIONTYPE_PIZ) {
    if (err) {
      (*err) = "PIZ compression is not supported in this build.";
    }
    return 0;
  }
#endif

#if !TINYEXR_USE_ZFP
  if (exr_header->compression_type == TINYEXR_COMPRESSIONTYPE_ZFP) {
    if (err) {
      (*err) = "ZFP compression is not supported in this build.";
    }
    return 0;
  }
#endif

#ifdef _WIN32
  FILE *fp = NULL;
  fopen_s(&fp, filename, "wb");
#else
  FILE *fp = fopen(filename, "wb");
#endif
  if (!fp) {
    if (err) {
      (*err) = "Cannot write a file.";
    }
    return TINYEXR_ERROR_CANT_OPEN_FILE;
  }

  unsigned char *mem = NULL;
  size_t mem_size = SaveEXRImageToMemory(exr_image, exr_header, &mem, err);

  if ((mem_size > 0) && mem) {
    fwrite(mem, 1, mem_size, fp);
  }
  free(mem);

  fclose(fp);

  return TINYEXR_SUCCESS;
}